

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

uint32 __thiscall
Js::RecyclableArrayWalker::GetItemCount(RecyclableArrayWalker *this,JavascriptArray *arrayObj)

{
  Type *pTVar1;
  code *pcVar2;
  bool bVar3;
  uint32 index;
  uint uVar4;
  undefined4 *puVar5;
  ArenaAllocator *alloc;
  List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *pLVar6;
  uint uVar7;
  
  if (this->pAbsoluteIndexList ==
      (List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
      0x0) {
    if (arrayObj == (JavascriptArray *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                  ,0xb2f,"(arrayObj)","arrayObj");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
    alloc = GetArenaFromContext((this->super_RecyclableObjectWalker).scriptContext);
    pLVar6 = (List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              *)new<Memory::ArenaAllocator>(0x30,alloc,0x366bee);
    (pLVar6->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).buffer =
         (Type)0x0;
    (pLVar6->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).count = 0;
    (pLVar6->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).alloc =
         alloc;
    (pLVar6->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).
    _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014ea098;
    pLVar6->length = 0;
    pLVar6->increment = 4;
    this->pAbsoluteIndexList = pLVar6;
    index = 0xffffffff;
    uVar4 = 0xffffffff;
    uVar7 = 0xffffffff;
    do {
      if (uVar7 == index) {
        index = JavascriptArray::GetNextIndex(arrayObj,index);
      }
      if (uVar7 == uVar4) {
        uVar4 = (*(this->super_RecyclableObjectWalker).super_IDiagObjectModelWalkerBase.
                  _vptr_IDiagObjectModelWalkerBase[4])();
      }
      uVar7 = uVar4;
      if (index < uVar4) {
        uVar7 = index;
      }
      if ((uVar7 == 0xffffffff) || ((arrayObj->super_ArrayObject).length <= uVar7)) break;
      pLVar6 = this->pAbsoluteIndexList;
      JsUtil::
      List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
      EnsureArray(pLVar6,0);
      (pLVar6->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).buffer
      [(pLVar6->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).count] =
           uVar7;
      pTVar1 = &(pLVar6->super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).
                count;
      *pTVar1 = *pTVar1 + 1;
    } while (uVar7 < (arrayObj->super_ArrayObject).length);
  }
  return (this->pAbsoluteIndexList->
         super_ReadOnlyList<unsigned_int,_Memory::ArenaAllocator,_DefaultComparer>).count;
}

Assistant:

uint32 RecyclableArrayWalker::GetItemCount(Js::JavascriptArray* arrayObj)
    {
        if (pAbsoluteIndexList == nullptr)
        {
            Assert(arrayObj);

            pAbsoluteIndexList = JsUtil::List<uint32, ArenaAllocator>::New(GetArenaFromContext(scriptContext));
            Assert(pAbsoluteIndexList);

            uint32 dataIndex = Js::JavascriptArray::InvalidIndex;
            uint32 descriptorIndex = Js::JavascriptArray::InvalidIndex;
            uint32 absIndex = Js::JavascriptArray::InvalidIndex;

            do
            {
                if (absIndex == dataIndex)
                {
                    dataIndex = arrayObj->GetNextIndex(dataIndex);
                }
                if (absIndex == descriptorIndex)
                {
                    descriptorIndex = GetNextDescriptor(descriptorIndex);
                }

                absIndex = min(dataIndex, descriptorIndex);

                if (absIndex == Js::JavascriptArray::InvalidIndex || absIndex >= arrayObj->GetLength())
                {
                    break;
                }

                pAbsoluteIndexList->Add(absIndex);

            } while (absIndex < arrayObj->GetLength());
        }

        return (uint32)pAbsoluteIndexList->Count();
    }